

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDeviceInitializationTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::createDeviceWithVariousQueueCountsTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *this;
  deUint32 dVar1;
  deUint32 queueFamilyIndex;
  PlatformInterface *vkPlatform;
  undefined8 uVar2;
  VkResult VVar3;
  VkPhysicalDevice pVVar4;
  pointer pVVar5;
  VkQueue queue;
  TestError *this_00;
  uint uVar6;
  pointer pVVar7;
  long lVar8;
  deUint32 queueIndex;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
  deviceQueueCreateInfos;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
  queueFamilyProperties;
  vector<float,_std::allocator<float>_> queuePriorities;
  VkDeviceCreateInfo deviceCreateInfo;
  VkDeviceQueueCreateInfo queueCreateInfo;
  InstanceDriver instanceDriver;
  VkDeviceQueueCreateInfo *local_8e8;
  iterator iStack_8e0;
  VkDeviceQueueCreateInfo *local_8d8;
  VkAllocationCallbacks *local_8c8;
  DestroyInstanceFunc local_8c0;
  TestStatus *local_8b8;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> local_8b0;
  VkAllocationCallbacks *local_898;
  DestroyInstanceFunc local_890;
  VkInstance local_888;
  VkPhysicalDevice local_880;
  TestLog *local_878;
  VkDeviceQueueCreateInfo *local_870;
  ulong local_868;
  vector<float,_std::allocator<float>_> local_860;
  VkDeviceCreateInfo local_848;
  Enum<vk::VkResult,_4UL> local_800;
  undefined1 local_7f0 [16];
  TestLog local_7e0 [13];
  ios_base local_778 [264];
  undefined1 local_670 [16];
  VkDeviceQueueCreateFlags local_660;
  deUint32 dStack_65c;
  uint uStack_658;
  undefined4 uStack_654;
  float *local_650;
  InstanceDriver local_1b8;
  
  vkPlatform = context->m_platformInterface;
  local_878 = context->m_testCtx->m_log;
  local_8b8 = __return_storage_ptr__;
  ::vk::createDefaultInstance((Move<vk::VkInstance_s_*> *)local_670,vkPlatform);
  uVar2 = local_670._0_8_;
  local_890 = (DestroyInstanceFunc)local_670._8_8_;
  local_898 = (VkAllocationCallbacks *)CONCAT44(dStack_65c,local_660);
  local_888 = (VkInstance)local_670._0_8_;
  ::vk::InstanceDriver::InstanceDriver(&local_1b8,vkPlatform,(VkInstance)local_670._0_8_);
  pVVar4 = ::vk::chooseDevice(&local_1b8.super_InstanceInterface,(VkInstance)uVar2,
                              context->m_testCtx->m_cmdLine);
  ::vk::getPhysicalDeviceQueueFamilyProperties(&local_8b0,&local_1b8.super_InstanceInterface,pVVar4)
  ;
  uVar6 = (int)((ulong)((long)local_8b0.
                              super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_8b0.
                             super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  uVar11 = 0;
  if (uVar6 != 0) {
    lVar8 = 0;
    uVar9 = uVar11;
    do {
      uVar10 = *(uint *)((long)&(local_8b0.
                                 super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->queueCount + lVar8);
      uVar11 = (ulong)uVar10;
      if (uVar10 < (uint)uVar9) {
        uVar11 = uVar9;
      }
      lVar8 = lVar8 + 0x18;
      uVar9 = uVar11;
    } while ((ulong)uVar6 * 0x18 != lVar8);
  }
  local_670._0_4_ = 0x3f800000;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_860,uVar11,(value_type_conflict2 *)local_670,(allocator_type *)local_7f0);
  local_8e8 = (VkDeviceQueueCreateInfo *)0x0;
  iStack_8e0._M_current = (VkDeviceQueueCreateInfo *)0x0;
  local_8d8 = (VkDeviceQueueCreateInfo *)0x0;
  if ((int)((ulong)((long)local_8b0.
                          super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_8b0.
                         super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 != 0) {
    uVar11 = 0;
    pVVar5 = local_8b0.
             super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pVVar7 = local_8b0.
             super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_880 = pVVar4;
    do {
      uVar6 = pVVar5[uVar11].queueCount;
      if (uVar6 != 0) {
        uVar10 = 1;
        do {
          local_670._0_4_ = 2;
          local_670._8_8_ = (DestroyInstanceFunc)0x0;
          local_660 = 0;
          dStack_65c = (deUint32)uVar11;
          local_650 = local_860.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
          uStack_658 = uVar10;
          if (iStack_8e0._M_current == local_8d8) {
            std::vector<vk::VkDeviceQueueCreateInfo,std::allocator<vk::VkDeviceQueueCreateInfo>>::
            _M_realloc_insert<vk::VkDeviceQueueCreateInfo_const&>
                      ((vector<vk::VkDeviceQueueCreateInfo,std::allocator<vk::VkDeviceQueueCreateInfo>>
                        *)&local_8e8,iStack_8e0,(VkDeviceQueueCreateInfo *)local_670);
          }
          else {
            (iStack_8e0._M_current)->pQueuePriorities =
                 local_860.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (iStack_8e0._M_current)->flags = (int)(uVar11 << 0x20);
            (iStack_8e0._M_current)->queueFamilyIndex = (int)((uVar11 << 0x20) >> 0x20);
            *(ulong *)&(iStack_8e0._M_current)->queueCount = CONCAT44(uStack_654,uVar10);
            (iStack_8e0._M_current)->sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
            *(undefined4 *)&(iStack_8e0._M_current)->field_0x4 = local_670._4_4_;
            *(undefined4 *)&(iStack_8e0._M_current)->pNext = 0;
            *(undefined4 *)((long)&(iStack_8e0._M_current)->pNext + 4) = 0;
            iStack_8e0._M_current = iStack_8e0._M_current + 1;
          }
          uVar10 = uVar10 + 1;
          pVVar5 = local_8b0.
                   super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pVVar7 = local_8b0.
                   super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        } while (uVar10 <= uVar6);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (uint)((int)((ulong)((long)pVVar7 - (long)pVVar5) >> 3) * -0x55555555));
    if (iStack_8e0._M_current != local_8e8) {
      uVar11 = 0;
      pVVar4 = local_880;
      do {
        local_870 = local_8e8 + uVar11;
        local_848.pNext = (void *)0x0;
        local_848.enabledExtensionCount = 0;
        local_848._52_4_ = 0;
        local_848.ppEnabledExtensionNames = (char **)0x0;
        local_848.enabledLayerCount = 0;
        local_848._36_4_ = 0;
        local_848.ppEnabledLayerNames = (char **)0x0;
        local_848.pEnabledFeatures = (VkPhysicalDeviceFeatures *)0x0;
        local_848.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
        local_848._4_4_ = 0;
        local_848.flags = 0;
        local_848.queueCreateInfoCount = 1;
        local_868 = uVar11;
        local_848.pQueueCreateInfos = local_870;
        ::vk::createDevice((Move<vk::VkDevice_s_*> *)local_670,&local_1b8.super_InstanceInterface,
                           pVVar4,&local_848,(VkAllocationCallbacks *)0x0);
        uVar2 = local_670._0_8_;
        local_8c0 = (DestroyInstanceFunc)local_670._8_8_;
        local_8c8 = (VkAllocationCallbacks *)CONCAT44(dStack_65c,local_660);
        ::vk::DeviceDriver::DeviceDriver
                  ((DeviceDriver *)local_670,&local_1b8.super_InstanceInterface,
                   (VkDevice)local_670._0_8_);
        dVar1 = (local_848.pQueueCreateInfos)->queueCount;
        if (dVar1 != 0) {
          queueFamilyIndex = (local_848.pQueueCreateInfos)->queueFamilyIndex;
          queueIndex = 0;
          do {
            queue = ::vk::getDeviceQueue
                              ((DeviceInterface *)local_670,(VkDevice)uVar2,queueFamilyIndex,
                               queueIndex);
            if (queue == (VkQueue)0x0) {
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,(char *)0x0,"!!queue",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiDeviceInitializationTests.cpp"
                         ,0x264);
              __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
            VVar3 = ::vk::DeviceDriver::queueWaitIdle((DeviceDriver *)local_670,queue);
            if (VVar3 != VK_SUCCESS) {
              this = (ostringstream *)(local_7f0 + 8);
              local_7f0._0_8_ = local_878;
              std::__cxx11::ostringstream::ostringstream(this);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this,"vkQueueWaitIdle failed",0x16);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this,",  queueIndex = ",0x10);
              std::ostream::_M_insert<unsigned_long>((ulong)this);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this,", queueCreateInfo ",0x12);
              ::vk::operator<<((ostream *)this,local_870);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this,", Error Code: ",0xe);
              local_800.m_getName = ::vk::getResultName;
              local_800.m_value = VVar3;
              tcu::Format::Enum<vk::VkResult,_4UL>::toStream(&local_800,(ostream *)this);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_7f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(this);
              std::ios_base::~ios_base(local_778);
              local_7f0._0_8_ = local_7e0;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_7f0,"Fail","");
              local_8b8->m_code = QP_TEST_RESULT_FAIL;
              (local_8b8->m_description)._M_dataplus._M_p =
                   (pointer)&(local_8b8->m_description).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_8b8->m_description,local_7f0._0_8_,
                         (long)(qpTestLog **)local_7f0._0_8_ + local_7f0._8_8_);
              if ((TestLog *)local_7f0._0_8_ != local_7e0) {
                operator_delete((void *)local_7f0._0_8_,
                                (ulong)((long)&(local_7e0[0].m_log)->flags + 1));
              }
              ::vk::DeviceDriver::~DeviceDriver((DeviceDriver *)local_670);
              if ((VkDevice)uVar2 != (VkDevice)0x0) {
                (*local_8c0)((VkInstance)uVar2,local_8c8);
              }
              goto LAB_003c7a23;
            }
            queueIndex = queueIndex + 1;
          } while (dVar1 != queueIndex);
        }
        ::vk::DeviceDriver::~DeviceDriver((DeviceDriver *)local_670);
        pVVar4 = local_880;
        if ((VkDevice)uVar2 != (VkDevice)0x0) {
          (*local_8c0)((VkInstance)uVar2,local_8c8);
        }
        uVar11 = local_868 + 1;
      } while (uVar11 < (ulong)(((long)iStack_8e0._M_current - (long)local_8e8 >> 3) *
                               -0x3333333333333333));
    }
  }
  local_670._0_8_ = (VkDevice)&local_660;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"Pass","");
  local_8b8->m_code = QP_TEST_RESULT_PASS;
  (local_8b8->m_description)._M_dataplus._M_p = (pointer)&(local_8b8->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_8b8->m_description,local_670._0_8_,
             (DestroyInstanceFunc)(local_670._8_8_ + local_670._0_8_));
  if ((VkDevice)local_670._0_8_ != (VkDevice)&local_660) {
    operator_delete((void *)local_670._0_8_,CONCAT44(dStack_65c,local_660) + 1);
  }
LAB_003c7a23:
  if (local_8e8 != (VkDeviceQueueCreateInfo *)0x0) {
    operator_delete(local_8e8,(long)local_8d8 - (long)local_8e8);
  }
  if (local_860.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_860.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_860.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_860.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_8b0.
      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_8b0.
                    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_8b0.
                          super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_8b0.
                          super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::vk::InstanceDriver::~InstanceDriver(&local_1b8);
  if (local_888 != (VkInstance)0x0) {
    (*local_890)(local_888,local_898);
  }
  return local_8b8;
}

Assistant:

tcu::TestStatus createDeviceWithVariousQueueCountsTest (Context& context)
{
	tcu::TestLog&							log						= context.getTestContext().getLog();
	const int								queueCountDiff			= 1;
	const PlatformInterface&				platformInterface		= context.getPlatformInterface();
	const Unique<VkInstance>				instance				(createDefaultInstance(platformInterface));
	const InstanceDriver					instanceDriver			(platformInterface, instance.get());
	const VkPhysicalDevice					physicalDevice			= chooseDevice(instanceDriver, instance.get(), context.getTestContext().getCommandLine());
	const vector<VkQueueFamilyProperties>	queueFamilyProperties	= getPhysicalDeviceQueueFamilyProperties(instanceDriver, physicalDevice);
	const vector<float>						queuePriorities			(getGlobalMaxQueueCount(queueFamilyProperties), 1.0f);
	vector<VkDeviceQueueCreateInfo>			deviceQueueCreateInfos;

	for (deUint32 queueFamilyNdx = 0; queueFamilyNdx < (deUint32)queueFamilyProperties.size(); queueFamilyNdx++)
	{
		const deUint32 maxQueueCount = queueFamilyProperties[queueFamilyNdx].queueCount;

		for (deUint32 queueCount = 1; queueCount <= maxQueueCount; queueCount += queueCountDiff)
		{
			const VkDeviceQueueCreateInfo queueCreateInfo =
			{
				VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO,
				DE_NULL,
				(VkDeviceQueueCreateFlags)0u,
				queueFamilyNdx,
				queueCount,
				queuePriorities.data()
			};

			deviceQueueCreateInfos.push_back(queueCreateInfo);
		}
	}

	for (size_t testNdx = 0; testNdx < deviceQueueCreateInfos.size(); testNdx++)
	{
		const VkDeviceQueueCreateInfo&	queueCreateInfo		= deviceQueueCreateInfos[testNdx];
		const VkDeviceCreateInfo		deviceCreateInfo	=
		{
			VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO,	//sType;
			DE_NULL,								//pNext;
			(VkDeviceCreateFlags)0u,
			1,										//queueRecordCount;
			&queueCreateInfo,						//pRequestedQueues;
			0,										//layerCount;
			DE_NULL,								//ppEnabledLayerNames;
			0,										//extensionCount;
			DE_NULL,								//ppEnabledExtensionNames;
			DE_NULL,								//pEnabledFeatures;
		};
		const Unique<VkDevice>			device				(createDevice(instanceDriver, physicalDevice, &deviceCreateInfo));
		const DeviceDriver				deviceDriver		(instanceDriver, device.get());
		const deUint32					queueFamilyIndex	= deviceCreateInfo.pQueueCreateInfos->queueFamilyIndex;
		const deUint32					queueCount			= deviceCreateInfo.pQueueCreateInfos->queueCount;

		for (deUint32 queueIndex = 0; queueIndex < queueCount; queueIndex++)
		{
			const VkQueue		queue	= getDeviceQueue(deviceDriver, *device, queueFamilyIndex, queueIndex);
			VkResult			result;

			TCU_CHECK(!!queue);

			result = deviceDriver.queueWaitIdle(queue);
			if (result != VK_SUCCESS)
			{
				log << TestLog::Message
					<< "vkQueueWaitIdle failed"
					<< ",  queueIndex = " << queueIndex
					<< ", queueCreateInfo " << queueCreateInfo
					<< ", Error Code: " << result
					<< TestLog::EndMessage;
				return tcu::TestStatus::fail("Fail");
			}
		}
	}
	return tcu::TestStatus::pass("Pass");
}